

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int doonnewstack(lua_State *L)

{
  char *buff;
  int local_2c;
  int status;
  char *s;
  size_t l;
  lua_State *L1;
  lua_State *L_local;
  
  L1 = L;
  l = (size_t)lua_newthread(L);
  buff = luaL_checklstring(L1,1,(size_t *)&s);
  local_2c = luaL_loadbufferx((lua_State *)l,buff,(size_t)s,buff,(char *)0x0);
  if (local_2c == 0) {
    local_2c = lua_pcallk((lua_State *)l,0,0,0,0,(lua_KFunction)0x0);
  }
  lua_pushinteger(L1,(long)local_2c);
  return 1;
}

Assistant:

static int doonnewstack (lua_State *L) {
  lua_State *L1 = lua_newthread(L);
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  int status = luaL_loadbuffer(L1, s, l, s);
  if (status == LUA_OK)
    status = lua_pcall(L1, 0, 0, 0);
  lua_pushinteger(L, status);
  return 1;
}